

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O1

int Acb_ObjSuppMin_int(Acb_Ntk_t *p,int iObj)

{
  uint *puVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int *pFanins;
  uint uVar9;
  word *pwVar10;
  char *__assertion;
  ulong uVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  int *piVar17;
  bool bVar18;
  
  if (iObj < 1) {
    __assertion = "i>0";
  }
  else {
    iVar8 = (p->vObjTruth).nSize;
    if (0 < iVar8) {
      if (iVar8 <= iObj) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                      ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      if ((p->vObjFans).nSize <= iObj) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = (p->vObjFans).pArray[(uint)iObj];
      lVar15 = (long)iVar8;
      if ((lVar15 < 0) || ((p->vFanSto).nSize <= iVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar17 = (p->vFanSto).pArray;
      puVar1 = (uint *)(piVar17 + lVar15);
      uVar16 = *puVar1;
      uVar14 = 0;
      if (0 < (int)uVar16) {
        uVar14 = (ulong)uVar16;
      }
      uVar11 = (p->vObjTruth).pArray[(uint)iObj];
      puVar12 = s_Truths6Neg + 5;
      uVar7 = 0;
      pwVar10 = s_Truths6Neg;
      do {
        uVar6 = uVar7;
        if (uVar14 == uVar6) {
          return 0;
        }
        uVar7 = uVar6 + 1;
        puVar12 = puVar12 + 3;
        uVar13 = *pwVar10;
        pwVar10 = pwVar10 + 1;
      } while ((uVar13 & (uVar11 >> ((byte)(1 << ((byte)uVar6 & 0x1f)) & 0x3f) ^ uVar11)) != 0);
      uVar2 = puVar1[uVar7];
      uVar16 = uVar16 - 1;
      *puVar1 = uVar16;
      uVar14 = uVar6;
      if ((int)uVar6 < (int)uVar16) {
        do {
          piVar17[lVar15 + uVar14 + 1] = piVar17[lVar15 + uVar14 + 2];
          uVar14 = uVar14 + 1;
          uVar16 = *puVar1;
        } while ((long)uVar14 < (long)(int)uVar16);
      }
      puVar1[(long)(int)uVar16 + 1] = 0xffffffff;
      if (((int)uVar2 < 0) || ((p->vFanouts).nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar3 = (p->vFanouts).pArray;
      uVar16 = pVVar3[uVar2].nSize;
      uVar14 = 0;
      bVar18 = 0 < (int)uVar16;
      if (0 < (int)uVar16) {
        bVar18 = true;
        if (*pVVar3[uVar2].pArray != iObj) {
          uVar13 = 0;
          do {
            if ((ulong)uVar16 - 1 == uVar13) {
              bVar18 = false;
              uVar14 = (ulong)uVar16;
              goto LAB_003803f4;
            }
            uVar14 = uVar13 + 1;
            lVar15 = uVar13 + 1;
            uVar13 = uVar14;
          } while (pVVar3[uVar2].pArray[lVar15] != iObj);
          bVar18 = uVar14 < uVar16;
        }
      }
LAB_003803f4:
      if ((uint)uVar14 != uVar16) {
        if (!bVar18) {
          __assert_fail("i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x3e5,"int Vec_IntRemove(Vec_Int_t *, int)");
        }
        uVar9 = (uint)uVar14 + 1;
        if ((int)uVar9 < (int)uVar16) {
          piVar4 = pVVar3[uVar2].pArray;
          piVar17 = piVar4 + uVar9;
          do {
            iVar8 = (int)uVar14;
            piVar4[uVar14 & 0xffffffff] = *piVar17;
            uVar16 = pVVar3[uVar2].nSize;
            piVar17 = piVar17 + 1;
            uVar14 = (ulong)(iVar8 + 1);
          } while (iVar8 + 2 < (int)uVar16);
        }
        pVVar3[uVar2].nSize = uVar16 - 1;
      }
      if (uVar6 < 5) {
        do {
          bVar5 = (byte)(1 << ((char)uVar7 - 1U & 0x1f));
          uVar11 = (uVar11 & *puVar12) >> (bVar5 & 0x3f) |
                   (puVar12[-1] & uVar11) << (bVar5 & 0x3f) | puVar12[-2] & uVar11;
          puVar12 = puVar12 + 3;
          iVar8 = (int)uVar7;
          uVar7 = uVar7 + 1;
        } while (iVar8 != 5);
      }
      if (iObj < (p->vObjTruth).nSize) {
        (p->vObjTruth).pArray[(uint)iObj] = uVar11;
        return 1;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
    }
    __assertion = "Acb_NtkHasObjTruths(p)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
}

Assistant:

int Acb_ObjSuppMin_int( Acb_Ntk_t * p, int iObj )
{
    int k, iFanin, * pFanins;
    word uTruth = Acb_ObjTruth( p, iObj );
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
    {
        if ( Abc_Tt6HasVar(uTruth, k) )
            continue;
        Acb_ObjDeleteFaninIndex( p, iObj, k );
        Vec_IntRemove( Vec_WecEntry(&p->vFanouts, iFanin), iObj );
        Vec_WrdWriteEntry( &p->vObjTruth, iObj, Abc_Tt6RemoveVar(uTruth, k) );
        return 1;
    }
    return 0;
}